

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covar.hpp
# Opt level: O2

void duckdb::CovarOperation::Operation<double,double,duckdb::CovarState,duckdb::RegrR2Operation>
               (CovarState *state,double *y,double *x,AggregateBinaryInput *idata)

{
  double dVar1;
  uint64_t uVar2;
  double dVar3;
  double dVar5;
  undefined1 auVar4 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar2 = state->count + 1;
  state->count = uVar2;
  auVar8._8_4_ = (int)(uVar2 >> 0x20);
  auVar8._0_8_ = uVar2;
  auVar8._12_4_ = 0x45300000;
  dVar3 = (double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0;
  dVar5 = auVar8._8_8_ - 1.9342813113834067e+25;
  dVar1 = *y;
  dVar6 = *x - state->meanx;
  auVar4._0_8_ = dVar5 + dVar3;
  auVar4._8_8_ = dVar5 + dVar3;
  auVar7._8_8_ = dVar1 - state->meany;
  auVar7._0_8_ = dVar6;
  auVar8 = divpd(auVar7,auVar4);
  dVar3 = auVar8._8_8_ + state->meany;
  state->meanx = auVar8._0_8_ + state->meanx;
  state->meany = dVar3;
  state->co_moment = (dVar1 - dVar3) * dVar6 + state->co_moment;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &y, const B_TYPE &x, AggregateBinaryInput &idata) {
		// update running mean and d^2
		const double n = static_cast<double>(++(state.count));

		const double dx = (x - state.meanx);
		const double meanx = state.meanx + dx / n;

		const double dy = (y - state.meany);
		const double meany = state.meany + dy / n;

		//  Schubert and Gertz SSDBM 2018 (4.3)
		const double C = state.co_moment + dx * (y - meany);

		state.meanx = meanx;
		state.meany = meany;
		state.co_moment = C;
	}